

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_regexp_constructor_internal(JSContext *ctx,JSValue ctor,JSValue pattern,JSValue bc)

{
  JSValue v;
  JSValue v_00;
  JSValue val;
  JSValue this_obj;
  JSValue JVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  undefined8 in_R8;
  JSValue JVar3;
  int in_stack_00000010;
  JSRegExp *re;
  JSObject *p;
  JSValue obj;
  JSContext *ctx_00;
  JSValueUnion in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  JSValueUnion local_98;
  JSValueUnion local_90;
  int iVar4;
  int class_id;
  int in_stack_ffffffffffffffd0;
  int32_t iVar5;
  undefined4 in_stack_ffffffffffffffd4;
  JSValueUnion local_28;
  
  ctx_00 = (JSContext *)&stack0x00000008;
  iVar4 = (int)in_R8;
  class_id = (int)((ulong)in_R8 >> 0x20);
  if ((in_stack_00000010 == -7) && (iVar4 == -7)) {
    JVar3.tag._0_4_ = in_stack_ffffffffffffffd0;
    JVar3.u = (JSValueUnion)in_RDX;
    JVar3.tag._4_4_ = in_stack_ffffffffffffffd4;
    JVar3 = js_create_from_ctor(in_RSI,JVar3,class_id);
    local_98 = JVar3.u;
    local_90 = (JSValueUnion)JVar3.tag;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 == 0) {
      *(undefined8 *)((long)local_98.ptr + 0x30) = in_RCX;
      *(undefined8 *)((long)local_98.ptr + 0x38) = *(undefined8 *)&ctx_00->header;
      this_obj.tag._0_4_ = iVar4;
      this_obj.u = (JSValueUnion)in_RCX;
      this_obj.tag._4_4_ = class_id;
      val.tag = (int64_t)in_RDI;
      val.u.ptr = local_90.ptr;
      JS_DefinePropertyValue
                ((JSContext *)local_98.ptr,this_obj,local_98._4_4_,val,in_stack_ffffffffffffffd0);
      iVar5 = local_98.int32;
      in_stack_ffffffffffffffd4 = local_98._4_4_;
      local_28 = local_90;
      goto LAB_0015cc2a;
    }
  }
  else {
    JS_ThrowTypeError(in_RDI,"string expected");
  }
  v.tag = in_stack_ffffffffffffff60;
  v.u.ptr = in_stack_ffffffffffffff58.ptr;
  JS_FreeValue(ctx_00,v);
  v_00.tag = in_stack_ffffffffffffff60;
  v_00.u.ptr = in_stack_ffffffffffffff58.ptr;
  JS_FreeValue(ctx_00,v_00);
  iVar5 = 0;
  local_28.float64 = 2.96439387504748e-323;
LAB_0015cc2a:
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = iVar5;
  JVar1.tag = (int64_t)local_28.ptr;
  return JVar1;
}

Assistant:

static JSValue js_regexp_constructor_internal(JSContext *ctx, JSValueConst ctor,
                                              JSValue pattern, JSValue bc)
{
    JSValue obj;
    JSObject *p;
    JSRegExp *re;

    /* sanity check */
    if (JS_VALUE_GET_TAG(bc) != JS_TAG_STRING ||
        JS_VALUE_GET_TAG(pattern) != JS_TAG_STRING) {
        JS_ThrowTypeError(ctx, "string expected");
    fail:
        JS_FreeValue(ctx, bc);
        JS_FreeValue(ctx, pattern);
        return JS_EXCEPTION;
    }

    obj = js_create_from_ctor(ctx, ctor, JS_CLASS_REGEXP);
    if (JS_IsException(obj))
        goto fail;
    p = JS_VALUE_GET_OBJ(obj);
    re = &p->u.regexp;
    re->pattern = JS_VALUE_GET_STRING(pattern);
    re->bytecode = JS_VALUE_GET_STRING(bc);
    JS_DefinePropertyValue(ctx, obj, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0),
                           JS_PROP_WRITABLE);
    return obj;
}